

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O2

PyObject * pybind11::detail::make_object_base_type(PyTypeObject *metaclass)

{
  int iVar1;
  handle hVar2;
  handle obj;
  object name_obj;
  object local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  hVar2.m_ptr = (PyObject *)PyUnicode_FromString("pybind11_object");
  local_60.super_handle.m_ptr = (handle)(handle)hVar2.m_ptr;
  obj.m_ptr = (*metaclass->tp_alloc)(metaclass,0);
  if (obj.m_ptr == (PyObject *)0x0) {
    pybind11_fail("make_object_base_type(): error allocating type!");
  }
  if (hVar2.m_ptr != (PyObject *)0x0) {
    (hVar2.m_ptr)->ob_refcnt = (hVar2.m_ptr)->ob_refcnt + 2;
  }
  obj.m_ptr[0x35].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  obj.m_ptr[0x36].ob_refcnt = (Py_ssize_t)hVar2.m_ptr;
  obj.m_ptr[1].ob_type = (PyTypeObject *)"pybind11_object";
  _PyBaseObject_Type = _PyBaseObject_Type + 1;
  obj.m_ptr[0x10].ob_refcnt = (Py_ssize_t)&PyBaseObject_Type;
  obj.m_ptr[2].ob_refcnt = 0x38;
  obj.m_ptr[10].ob_type = (PyTypeObject *)0x600;
  obj.m_ptr[0x13].ob_type = (PyTypeObject *)pybind11_object_new;
  obj.m_ptr[0x12].ob_type = (PyTypeObject *)pybind11_object_init;
  obj.m_ptr[3].ob_refcnt = (Py_ssize_t)pybind11_object_dealloc;
  obj.m_ptr[0xd].ob_refcnt = 0x28;
  iVar1 = PyType_Ready(obj.m_ptr);
  if (-1 < iVar1) {
    str::str((str *)&local_58,"pybind11_builtins");
    setattr(obj,"__module__",(handle)local_58._M_dataplus._M_p);
    object::~object((object *)&local_58);
    if (((ulong)obj.m_ptr[10].ob_type & 0x4000) == 0) {
      object::~object(&local_60);
      return obj.m_ptr;
    }
    __assert_fail("!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]cmake_example/pybind11/include/pybind11/detail/class.h"
                  ,0x1f7,"PyObject *pybind11::detail::make_object_base_type(PyTypeObject *)");
  }
  error_string_abi_cxx11_();
  std::operator+(&local_58,"PyType_Ready failed in make_object_base_type():",&local_38);
  pybind11_fail(&local_58);
}

Assistant:

inline PyObject *make_object_base_type(PyTypeObject *metaclass) {
    constexpr auto *name = "pybind11_object";
    auto name_obj = reinterpret_steal<object>(PYBIND11_FROM_STRING(name));

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto *heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type) {
        pybind11_fail("make_object_base_type(): error allocating type!");
    }

    heap_type->ht_name = name_obj.inc_ref().ptr();
#ifdef PYBIND11_BUILTIN_QUALNAME
    heap_type->ht_qualname = name_obj.inc_ref().ptr();
#endif

    auto *type = &heap_type->ht_type;
    type->tp_name = name;
    type->tp_base = type_incref(&PyBaseObject_Type);
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    type->tp_flags = Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;

    type->tp_new = pybind11_object_new;
    type->tp_init = pybind11_object_init;
    type->tp_dealloc = pybind11_object_dealloc;

    /* Support weak references (needed for the keep_alive feature) */
    type->tp_weaklistoffset = offsetof(instance, weakrefs);

    if (PyType_Ready(type) < 0) {
        pybind11_fail("PyType_Ready failed in make_object_base_type():" + error_string());
    }

    setattr((PyObject *) type, "__module__", str("pybind11_builtins"));
    PYBIND11_SET_OLDPY_QUALNAME(type, name_obj);

    assert(!PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));
    return (PyObject *) heap_type;
}